

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmarker.c
# Opt level: O0

void write_frame_header(j_compress_ptr cinfo)

{
  int iVar1;
  long *in_RDI;
  jpeg_component_info *compptr;
  boolean is_baseline;
  int prec;
  int ci;
  JPEG_MARKER in_stack_ffffffffffffffdc;
  j_compress_ptr cinfo_00;
  int in_stack_ffffffffffffffec;
  int iVar2;
  int iVar3;
  
  iVar2 = 0;
  cinfo_00 = (j_compress_ptr)in_RDI[0xb];
  for (iVar3 = 0; iVar3 < *(int *)((long)in_RDI + 0x4c); iVar3 = iVar3 + 1) {
    iVar1 = emit_dqt((j_compress_ptr)CONCAT44(iVar3,iVar2),in_stack_ffffffffffffffec);
    iVar2 = iVar1 + iVar2;
    cinfo_00 = (j_compress_ptr)cinfo_00->quant_tbl_ptrs;
  }
  if (((*(int *)((long)in_RDI + 0x104) == 0) && (*(int *)((long)in_RDI + 0x134) == 0)) &&
     ((int)in_RDI[9] == 8)) {
    iVar3 = 1;
    cinfo_00 = (j_compress_ptr)in_RDI[0xb];
    for (iVar1 = 0; iVar1 < *(int *)((long)in_RDI + 0x4c); iVar1 = iVar1 + 1) {
      if ((1 < *(int *)((long)&cinfo_00->progress + 4)) || (1 < *(int *)&cinfo_00->client_data)) {
        iVar3 = 0;
      }
      cinfo_00 = (j_compress_ptr)cinfo_00->quant_tbl_ptrs;
    }
    if ((iVar2 != 0) && (iVar3 != 0)) {
      iVar3 = 0;
      *(undefined4 *)(*in_RDI + 0x28) = 0x4b;
      (**(code **)(*in_RDI + 8))(in_RDI,0);
    }
  }
  else {
    iVar3 = 0;
  }
  if (*(int *)((long)in_RDI + 0x104) == 0) {
    if (*(int *)((long)in_RDI + 0x134) == 0) {
      if (iVar3 == 0) {
        emit_sof(cinfo_00,in_stack_ffffffffffffffdc);
      }
      else {
        emit_sof(cinfo_00,in_stack_ffffffffffffffdc);
      }
    }
    else {
      emit_sof(cinfo_00,in_stack_ffffffffffffffdc);
    }
  }
  else if (*(int *)((long)in_RDI + 0x134) == 0) {
    emit_sof(cinfo_00,in_stack_ffffffffffffffdc);
  }
  else {
    emit_sof(cinfo_00,in_stack_ffffffffffffffdc);
  }
  return;
}

Assistant:

METHODDEF(void)
write_frame_header(j_compress_ptr cinfo)
{
  int ci, prec;
  boolean is_baseline;
  jpeg_component_info *compptr;

  /* Emit DQT for each quantization table.
   * Note that emit_dqt() suppresses any duplicate tables.
   */
  prec = 0;
  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    prec += emit_dqt(cinfo, compptr->quant_tbl_no);
  }
  /* now prec is nonzero iff there are any 16-bit quant tables. */

  /* Check for a non-baseline specification.
   * Note we assume that Huffman table numbers won't be changed later.
   */
  if (cinfo->arith_code || cinfo->progressive_mode ||
      cinfo->data_precision != 8) {
    is_baseline = FALSE;
  } else {
    is_baseline = TRUE;
    for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
         ci++, compptr++) {
      if (compptr->dc_tbl_no > 1 || compptr->ac_tbl_no > 1)
        is_baseline = FALSE;
    }
    if (prec && is_baseline) {
      is_baseline = FALSE;
      /* If it's baseline except for quantizer size, warn the user */
      TRACEMS(cinfo, 0, JTRC_16BIT_TABLES);
    }
  }

  /* Emit the proper SOF marker */
  if (cinfo->arith_code) {
    if (cinfo->progressive_mode)
      emit_sof(cinfo, M_SOF10); /* SOF code for progressive arithmetic */
    else
      emit_sof(cinfo, M_SOF9);  /* SOF code for sequential arithmetic */
  } else {
    if (cinfo->progressive_mode)
      emit_sof(cinfo, M_SOF2);  /* SOF code for progressive Huffman */
    else if (is_baseline)
      emit_sof(cinfo, M_SOF0);  /* SOF code for baseline implementation */
    else
      emit_sof(cinfo, M_SOF1);  /* SOF code for non-baseline Huffman file */
  }
}